

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O0

Maybe<capnp::MessageReaderAndFds> * __thiscall
kj::
NoInfer_<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:236:23)>
::Type::operator()(Maybe<capnp::MessageReaderAndFds> *__return_storage_ptr__,void *this,
                  Maybe<unsigned_long> *nfds)

{
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> *other;
  MessageReaderAndFds local_50;
  size_t *local_30;
  unsigned_long *n;
  unsigned_long *_n238;
  Maybe<unsigned_long> *nfds_local;
  Type *this_local;
  
  _n238 = (unsigned_long *)nfds;
  nfds_local = (Maybe<unsigned_long> *)this;
  this_local = (Type *)__return_storage_ptr__;
  local_30 = kj::_::readMaybe<unsigned_long>(nfds);
  n = local_30;
  if (local_30 == (unsigned_long *)0x0) {
    Maybe<capnp::MessageReaderAndFds>::Maybe(__return_storage_ptr__);
  }
  else {
    other = mv<kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,decltype(nullptr)>>
                      ((Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> *)this
                      );
    Own<capnp::MessageReader,decltype(nullptr)>::
    Own<capnp::(anonymous_namespace)::AsyncMessageReader,void>
              ((Own<capnp::MessageReader,decltype(nullptr)> *)&local_50,other);
    local_50.fds = ArrayPtr<kj::OwnFd>::first((ArrayPtr<kj::OwnFd> *)((long)this + 0x10),*local_30);
    Maybe<capnp::MessageReaderAndFds>::Maybe(__return_storage_ptr__,&local_50);
    ::capnp::MessageReaderAndFds::~MessageReaderAndFds(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

KJ_IF_SOME(n, nfds) {
      return MessageReaderAndFds { kj::mv(reader), fdSpace.first(n) };
    }